

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O1

class_<anurbs::BrepFaceField<3L>,_std::shared_ptr<anurbs::BrepFaceField<3L>_>_> * __thiscall
pybind11::class_<anurbs::BrepFaceField<3l>,std::shared_ptr<anurbs::BrepFaceField<3l>>>::
def<void(anurbs::BrepFaceField<3l>::*)(long,Eigen::Matrix<double,1,3,1,1,3>const&),pybind11::arg,pybind11::arg>
          (class_<anurbs::BrepFaceField<3l>,std::shared_ptr<anurbs::BrepFaceField<3l>>> *this,
          char *name_,offset_in_Model_to_subr *f,arg *extra,arg *extra_1)

{
  offset_in_Model_to_subr f_00;
  name *extra_00;
  handle local_78;
  undefined1 local_70 [8];
  cpp_function cf;
  object local_60;
  object local_58;
  is_method local_50;
  handle local_48;
  handle local_40;
  object local_38;
  
  f_00 = *f;
  extra_00 = (name *)f[1];
  local_60.super_handle.m_ptr = *(handle *)this;
  local_58.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_50.class_.m_ptr = (handle)(handle)name_;
  local_78.m_ptr = (PyObject *)PyObject_GetAttrString();
  if (local_78.m_ptr == (PyObject *)0x0) {
    PyErr_Clear();
    local_78.m_ptr = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  local_70 = (undefined1  [8])local_78.m_ptr;
  cpp_function::
  cpp_function<void,anurbs::BrepFaceField<3l>,long,Eigen::Matrix<double,1,3,1,1,3>const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg>
            (&cf,f_00,extra_00,&local_50,(sibling *)&local_60,(arg *)local_70,extra);
  object::~object((object *)&local_78);
  object::~object(&local_58);
  cpp_function::name((cpp_function *)local_70);
  local_48.m_ptr = *(PyObject **)this;
  if ((object)local_70 != (PyObject *)0x0) {
    *(long *)local_70 = *(long *)local_70 + 1;
  }
  local_40.m_ptr = (PyObject *)local_70;
  local_60.super_handle.m_ptr = (handle)(PyObject *)0x0;
  local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
  object::~object(&local_60);
  detail::accessor_policies::obj_attr::set
            (local_48,local_40,(handle)cf.super_function.super_object.super_handle.m_ptr);
  object::~object(&local_38);
  object::~object((object *)&local_40);
  object::~object((object *)local_70);
  object::~object((object *)&cf);
  return (class_<anurbs::BrepFaceField<3L>,_std::shared_ptr<anurbs::BrepFaceField<3L>_>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }